

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

void __thiscall
t_go_generator::generate_deserialize_list_element
          (t_go_generator *this,ostream *out,t_list *tlist,bool declare,string *prefix)

{
  t_type *type;
  ostream *poVar1;
  allocator local_151;
  string elem;
  string local_130;
  string local_110;
  string local_f0;
  t_field felem;
  
  std::__cxx11::string::string((string *)&local_f0,"_elem",(allocator *)&felem);
  t_generator::tmp(&elem,&this->super_t_generator,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  type = tlist->elem_type_;
  std::__cxx11::string::string((string *)&local_110,(string *)&elem);
  t_field::t_field(&felem,type,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  felem.req_ = T_OPT_IN_REQ_OUT;
  std::__cxx11::string::string((string *)&local_130,"",&local_151);
  generate_deserialize_field(this,out,&felem,true,&local_130,false,false,false,false);
  std::__cxx11::string::~string((string *)&local_130);
  poVar1 = t_generator::indent(&this->super_t_generator,out);
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1," = append(");
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,(string *)&elem);
  poVar1 = std::operator<<(poVar1,")");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_field::~t_field(&felem);
  std::__cxx11::string::~string((string *)&elem);
  return;
}

Assistant:

void t_go_generator::generate_deserialize_list_element(ostream& out,
                                                       t_list* tlist,
                                                       bool declare,
                                                       string prefix) {
  (void)declare;
  string elem = tmp("_elem");
  t_field felem(((t_list*)tlist)->get_elem_type(), elem);
  felem.set_req(t_field::T_OPT_IN_REQ_OUT);
  generate_deserialize_field(out, &felem, true, "", false, false, false, true);
  indent(out) << prefix << " = append(" << prefix << ", " << elem << ")" << endl;
}